

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomBernoulliDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  undefined1 *puVar4;
  long *plVar5;
  size_type *psVar6;
  Result *_result;
  string err;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (layer->_oneof_case_[0] == 0x4c4) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_RandomBernoulliDynamicLayerParams_default_instance_;
          }
          if ((((UnaryFunctionLayerParams *)puVar4)->epsilon_ < 0.0) ||
             (1.0 < ((UnaryFunctionLayerParams *)puVar4)->epsilon_)) {
            std::operator+(&local_40,"Value of prob should be in range [0: 1] for \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            Result::Result(__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomBernoulliDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randombernoullidynamic();
    if (params.prob() < 0.0f || params.prob() > 1.0f) {
        const std::string err = "Value of prob should be in range [0: 1] for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}